

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
Operation<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
          (ArgMinMaxBase<duckdb::GreaterThan,false> *this,
          ArgMinMaxState<double,_duckdb::string_t> *state,double *x,string_t *y,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  string_t y_data;
  
  if (*this != (ArgMinMaxBase<duckdb::GreaterThan,false>)0x0) {
    y_data.value.pointer.ptr = (char *)y;
    y_data.value._0_8_ = x[1];
    Execute<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>>
              (this,(ArgMinMaxState<double,_duckdb::string_t> *)*x,*(double *)state,y_data,binary);
    return;
  }
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (*(TemplatedValidityMask<unsigned_long> **)&y[1].value,*(idx_t *)&y[2].value);
  if (bVar1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)(y->value).pointer.ptr,
                       (idx_t)y[1].value.pointer.ptr);
    Assign<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>>
              ((ArgMinMaxState<double,_duckdb::string_t> *)this,(double *)state,(string_t *)x,!bVar1
              );
    *this = (ArgMinMaxBase<duckdb::GreaterThan,false>)0x1;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}